

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O3

bool QChar::isPrint(char32_t ucs4)

{
  uint uVar1;
  uint uVar2;
  
  if (0x10ffff < (uint)ucs4) {
    return false;
  }
  uVar2 = 0xff;
  if ((uint)ucs4 < 0x11000) {
    uVar2 = 0x1f;
  }
  uVar1 = (uint)ucs4 >> 5;
  if (0x10fff < (uint)ucs4) {
    uVar1 = ((uint)(ucs4 + L'\xfffef000') >> 8) + 0x880;
  }
  return (0x3e00U >>
          (*(uint *)(QUnicodeTables::uc_properties +
                    (ulong)*(ushort *)
                            (QUnicodeTables::uc_property_trie +
                            (ulong)(uint)((uVar2 & ucs4) +
                                         (uint)*(ushort *)
                                                (QUnicodeTables::uc_property_trie + (ulong)uVar1 * 2
                                                )) * 2) * 0x14) & 0x1f) & 1) == 0;
}

Assistant:

bool QChar::isPrint(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return false;
    const int test = FLAG(Other_Control) |
                     FLAG(Other_Format) |
                     FLAG(Other_Surrogate) |
                     FLAG(Other_PrivateUse) |
                     FLAG(Other_NotAssigned);
    return !(FLAG(qGetProp(ucs4)->category) & test);
}